

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_std_suite.cpp
# Opt level: O2

void map_suite::fail_missing_pair_end(void)

{
  value_type input [7];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  value;
  iarchive in;
  uchar local_100 [40];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  local_d8;
  iarchive local_a8;
  
  local_100[4] = '\x01';
  local_100[5] = 'A';
  local_100[6] = 0x81;
  local_100[0] = 0x9c;
  local_100[1] = 0x82;
  local_100[2] = 0x90;
  local_100[3] = 0xa9;
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[7]>
            (&local_a8,(uchar (*) [7])local_100);
  local_d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8._M_impl.super__Rb_tree_header._M_header;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8._M_impl.super__Rb_tree_header._M_header._M_left;
  trial::protocol::bintoken::iarchive::
  load_override<std::map<std::__cxx11::string,bool,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>>
            (&local_a8,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              *)&local_d8);
  boost::detail::throw_failed_impl
            ("in >> value","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x3c2,"void map_suite::fail_missing_pair_end()");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~_Rb_tree(&local_d8);
  trial::protocol::bintoken::iarchive::~iarchive(&local_a8);
  return;
}

Assistant:

void fail_missing_pair_end()
{
    const value_type input[] = { token::code::deprecated_begin_assoc_array,
                                 token::code::null,
                                 token::code::begin_record,
                                 token::code::string8, 0x01, 0x41,
                                 token::code::true_value };
    format::iarchive in(input);
    std::map<std::string, bool> value;
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(in >> value,
                                    format::error, "unexpected token");
}